

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O0

int hamming(uint64_t x)

{
  ulong uVar1;
  uint64_t x_local;
  
  uVar1 = x - (x >> 1 & 0x5555555555555555);
  uVar1 = (uVar1 & 0x3333333333333333) + (uVar1 >> 2 & 0x3333333333333333);
  return (int)(byte)((uVar1 + (uVar1 >> 4) & 0xf0f0f0f0f0f0f0f) * 0x101010101010101 >> 0x38);
}

Assistant:

static inline int hamming(uint64_t x) {
#if defined(_WIN64) && defined(_MSC_VER) && !defined(__clang__)
  return (int) __popcnt64(x);
#elif defined(_WIN32) && defined(_MSC_VER) && !defined(__clang__)
    return (int) __popcnt(( unsigned int)x) + (int)  __popcnt(( unsigned int)(x>>32));
#else
    return __builtin_popcountll(x);
#endif
}